

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

realtype N_VMinQuotient_SensWrapper(N_Vector num,N_Vector denom)

{
  realtype rVar1;
  realtype tmp;
  realtype min;
  int i;
  N_Vector denom_local;
  N_Vector num_local;
  
  tmp = N_VMinQuotient((N_Vector)**num->content,(N_Vector)**denom->content);
  for (min._4_4_ = 1; min._4_4_ < *(int *)((long)num->content + 8); min._4_4_ = min._4_4_ + 1) {
    rVar1 = N_VMinQuotient(*(N_Vector *)(*num->content + (long)min._4_4_ * 8),
                           *(N_Vector *)(*denom->content + (long)min._4_4_ * 8));
    if (rVar1 < tmp) {
      tmp = rVar1;
    }
  }
  return tmp;
}

Assistant:

realtype N_VMinQuotient_SensWrapper(N_Vector num, N_Vector denom)
{
  int i;
  realtype min, tmp;

  min = N_VMinQuotient(NV_VEC_SW(num,0), NV_VEC_SW(denom,0));

  for (i=1; i < NV_NVECS_SW(num); i++) {
    tmp = N_VMinQuotient(NV_VEC_SW(num,i), NV_VEC_SW(denom,i));
    if (tmp < min) min = tmp;
  }

  return(min);
}